

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O0

void __thiscall
duckdb::PrimitiveDictionary<unsigned_int,_unsigned_int,_duckdb::ParquetCastOperator>::Insert
          (PrimitiveDictionary<unsigned_int,_unsigned_int,_duckdb::ParquetCastOperator> *this,
          uint value)

{
  idx_t iVar1;
  bool bVar2;
  primitive_dictionary_entry_t *this_00;
  uint in_ESI;
  PrimitiveDictionary<unsigned_int,_unsigned_int,_duckdb::ParquetCastOperator> *in_RDI;
  primitive_dictionary_entry_t *entry;
  uint *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  PrimitiveDictionary<unsigned_int,_unsigned_int,_duckdb::ParquetCastOperator> *this_01;
  
  if ((in_RDI->full & 1U) == 0) {
    this_01 = in_RDI;
    this_00 = Lookup((PrimitiveDictionary<unsigned_int,_unsigned_int,_duckdb::ParquetCastOperator> *
                     )CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
    bVar2 = primitive_dictionary_entry_t::IsEmpty(this_00);
    if (bVar2) {
      if ((in_RDI->maximum_size < in_RDI->size + 1) ||
         (bVar2 = AddToTarget<unsigned_int,_0>
                            (this_01,(uint *)CONCAT44(in_ESI,in_stack_fffffffffffffff0)), !bVar2)) {
        in_RDI->full = true;
      }
      else {
        this_00->value = in_ESI;
        iVar1 = in_RDI->size;
        in_RDI->size = iVar1 + 1;
        this_00->index = (uint32_t)iVar1;
      }
    }
  }
  return;
}

Assistant:

void Insert(SRC value) {
		if (full) {
			return;
		}
		auto &entry = Lookup(value);
		if (entry.IsEmpty()) {
			if (size + 1 > maximum_size || !AddToTarget(value)) {
				full = true;
				return;
			}
			entry.value = value;
			entry.index = size++;
		}
	}